

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  int *piVar8;
  int _w_00;
  long lVar9;
  ulong uVar10;
  long lVar11;
  void *__dest;
  Mat local_78;
  
  iVar1 = this->w;
  iVar2 = this->h;
  iVar3 = this->d;
  iVar4 = this->c;
  _w_00 = _h * _w * _c;
  if (iVar3 * iVar4 * iVar2 * iVar1 == _w_00) {
    iVar5 = this->dims;
    if (iVar5 < 3) {
      lVar11 = (long)_h * (long)_w;
      sVar6 = this->elemsize;
      if (lVar11 - (sVar6 * lVar11 + 0xf & 0xfffffffffffffff0) / sVar6 != 0) {
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->d = 0;
        __return_storage_ptr__->c = 0;
        create(__return_storage_ptr__,_w,_h,_c,sVar6,this->elempack,_allocator);
        if (__return_storage_ptr__->data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if (_c < 1 || (long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        uVar10 = (ulong)(uint)_c;
        __dest = __return_storage_ptr__->data;
        sVar6 = __return_storage_ptr__->cstep;
        sVar7 = __return_storage_ptr__->elemsize;
        lVar9 = 0;
        do {
          memcpy(__dest,(void *)(lVar9 * this->elemsize + (long)this->data),this->elemsize * lVar11)
          ;
          __dest = (void *)((long)__dest + sVar6 * sVar7);
          lVar9 = lVar9 + lVar11;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        return __return_storage_ptr__;
      }
    }
    else if (iVar4 != _c) {
      reshape(&local_78,this,_w_00,_allocator);
      reshape(__return_storage_ptr__,&local_78,_w,_h,_c,_allocator);
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(local_78.data);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->data = this->data;
    piVar8 = this->refcount;
    __return_storage_ptr__->refcount = piVar8;
    __return_storage_ptr__->elemsize = this->elemsize;
    __return_storage_ptr__->elempack = this->elempack;
    __return_storage_ptr__->allocator = this->allocator;
    __return_storage_ptr__->dims = iVar5;
    __return_storage_ptr__->w = iVar1;
    __return_storage_ptr__->h = iVar2;
    __return_storage_ptr__->d = iVar3;
    __return_storage_ptr__->c = iVar4;
    __return_storage_ptr__->cstep = this->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->d = 1;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         ((long)_h * (long)_w * this->elemsize + 0xf & 0xfffffffffffffff0) / this->elemsize;
  }
  else {
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize((size_t)_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);
            if (m.empty())
                return m;

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * elemsize, 16) / elemsize;

    return m;
}